

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

mp_int * eddsa_signing_exponent_from_data
                   (eddsa_key *ek,ecsign_extra *extra,ptrlen r_encoded,ptrlen data)

{
  ssh_hash *h_00;
  mp_int *pmVar1;
  ptrlen bytes;
  mp_int *toret;
  ssh_hash *h;
  uchar hash [114];
  ecsign_extra *extra_local;
  eddsa_key *ek_local;
  ptrlen data_local;
  ptrlen r_encoded_local;
  
  h_00 = ssh_hash_new(extra->hash);
  BinarySink_put_datapl(h_00->binarysink_,extra->hash_prefix);
  BinarySink_put_datapl(h_00->binarysink_,r_encoded);
  BinarySink_put_epoint(h_00->binarysink_,ek->publicKey,ek->curve,true);
  BinarySink_put_datapl(h_00->binarysink_,data);
  ssh_hash_final(h_00,(uchar *)&h);
  bytes = make_ptrlen(&h,extra->hash->hlen);
  pmVar1 = mp_from_bytes_le(bytes);
  smemclr(&h,extra->hash->hlen);
  return pmVar1;
}

Assistant:

static mp_int *eddsa_signing_exponent_from_data(
    struct eddsa_key *ek, const struct ecsign_extra *extra,
    ptrlen r_encoded, ptrlen data)
{
    /* Hash (r || public key || message) */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    put_datapl(h, extra->hash_prefix);
    put_datapl(h, r_encoded);
    put_epoint(h, ek->publicKey, ek->curve, true); /* omit string header */
    put_datapl(h, data);
    ssh_hash_final(h, hash);

    /* Convert to an integer */
    mp_int *toret = mp_from_bytes_le(make_ptrlen(hash, extra->hash->hlen));

    smemclr(hash, extra->hash->hlen);
    return toret;
}